

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O2

unsigned_short
duckdb::BitwiseShiftLeftOperator::Operation<unsigned_short,unsigned_short,unsigned_short>
          (unsigned_short input,unsigned_short shift)

{
  OutOfRangeException *pOVar1;
  undefined6 in_register_0000003a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (shift < 0x11) {
    if (shift != 0) {
      if ((ushort)(1 << (0x10 - (byte)shift & 0x1f)) <= input) {
        pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_98,"Overflow in left shift (%s << %s)",&local_99);
        NumericHelper::ToString<unsigned_short>(&local_58,input);
        NumericHelper::ToString<unsigned_short>(&local_78,shift);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                  (pOVar1,&local_98,&local_58,&local_78);
        __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      input = (unsigned_short)((int)CONCAT62(in_register_0000003a,input) << ((byte)shift & 0x1f));
    }
  }
  else {
    if (input != 0) {
      pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_98,"Left-shift value %s is out of range",&local_99);
      NumericHelper::ToString<unsigned_short>(&local_38,shift);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_98,&local_38);
      __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    input = 0;
  }
  return input;
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}